

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O3

int alsa_stream_init(cubeb_conflict1 *ctx,cubeb_stream_conflict1 **stream,char *stream_name,
                    cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                    cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                    uint latency_frames,cubeb_data_callback_conflict1 data_callback,
                    cubeb_state_callback_conflict1 state_callback,void *user_ptr)

{
  int iVar1;
  cubeb_stream_conflict1 *pcVar2;
  void *in_stack_ffffffffffffffb0;
  cubeb_stream_conflict1 *outstm;
  cubeb_stream_conflict1 *instm;
  
  iVar1 = 0;
  instm = (cubeb_stream_conflict1 *)0x0;
  outstm = (cubeb_stream_conflict1 *)0x0;
  if (input_stream_params != (cubeb_stream_params *)0x0) {
    iVar1 = alsa_stream_init_single
                      (ctx,&instm,(char *)0x1,(snd_pcm_stream_t)input_device,input_stream_params,
                       (cubeb_stream_params *)(ulong)latency_frames,(uint)data_callback,
                       (cubeb_data_callback_conflict1)state_callback,
                       (cubeb_state_callback_conflict1)user_ptr,in_stack_ffffffffffffffb0);
  }
  if (output_stream_params != (cubeb_stream_params *)0x0 && iVar1 == 0) {
    iVar1 = alsa_stream_init_single
                      (ctx,&outstm,(char *)0x0,(snd_pcm_stream_t)output_device,output_stream_params,
                       (cubeb_stream_params *)(ulong)latency_frames,(uint)data_callback,
                       (cubeb_data_callback_conflict1)state_callback,
                       (cubeb_state_callback_conflict1)user_ptr,in_stack_ffffffffffffffb0);
  }
  pcVar2 = instm;
  if (((output_stream_params == (cubeb_stream_params *)0x0) ||
      (input_stream_params == (cubeb_stream_params *)0x0)) || (iVar1 != 0)) {
    if (instm != (cubeb_stream_conflict1 *)0x0 && iVar1 != 0) {
      alsa_stream_destroy(instm);
    }
  }
  else {
    instm->other_stream = outstm;
    outstm->other_stream = instm;
  }
  if (outstm != (cubeb_stream_conflict1 *)0x0) {
    pcVar2 = outstm;
  }
  *stream = pcVar2;
  return iVar1;
}

Assistant:

static int
alsa_stream_init(cubeb * ctx, cubeb_stream ** stream, char const * stream_name,
                 cubeb_devid input_device,
                 cubeb_stream_params * input_stream_params,
                 cubeb_devid output_device,
                 cubeb_stream_params * output_stream_params,
                 unsigned int latency_frames,
                 cubeb_data_callback data_callback, cubeb_state_callback state_callback,
                 void * user_ptr)
{
  int result = CUBEB_OK;
  cubeb_stream * instm = NULL, * outstm = NULL;

  if (result == CUBEB_OK && input_stream_params) {
    result = alsa_stream_init_single(ctx, &instm, stream_name, SND_PCM_STREAM_CAPTURE,
                                     input_device, input_stream_params, latency_frames,
                                     data_callback, state_callback, user_ptr);
  }

  if (result == CUBEB_OK && output_stream_params) {
    result = alsa_stream_init_single(ctx, &outstm, stream_name, SND_PCM_STREAM_PLAYBACK,
                                     output_device, output_stream_params, latency_frames,
                                     data_callback, state_callback, user_ptr);
  }

  if (result == CUBEB_OK && input_stream_params && output_stream_params) {
    instm->other_stream = outstm;
    outstm->other_stream = instm;
  }

  if (result != CUBEB_OK && instm) {
    alsa_stream_destroy(instm);
  }

  *stream = outstm ? outstm : instm;

  return result;
}